

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderPrimitiveCoverage.cpp
# Opt level: O2

void __thiscall
glcts::TessellationShaderPrimitiveCoverage::deinit(TessellationShaderPrimitiveCoverage *this)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  long lVar2;
  
  TestCaseBase::deinit(&this->super_TestCaseBase);
  if ((this->super_TestCaseBase).m_is_tessellation_shader_supported == true) {
    iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar2 = CONCAT44(extraout_var,iVar1);
    (**(code **)(lVar2 + 0x1680))(0);
    (**(code **)(lVar2 + 0x40))(0x8892,0);
    (**(code **)(lVar2 + 0x78))(0x8ca8,0);
    (**(code **)(lVar2 + 0x78))(0x8ca9,0);
    (**(code **)(lVar2 + 0x4e8))(0xb90);
    (**(code **)(lVar2 + 0xd8))(0);
    (**(code **)(lVar2 + 0xfd8))((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,3);
    err = (**(code **)(lVar2 + 0x800))();
    glu::checkError(err,"glPatchParameteriEXT() failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderPrimitiveCoverage.cpp"
                    ,0xf5);
    if (this->m_rendered_data_buffer != (GLubyte *)0x0) {
      free(this->m_rendered_data_buffer);
      this->m_rendered_data_buffer = (GLubyte *)0x0;
    }
    if (this->m_quad_tessellation_po_id != 0) {
      (**(code **)(lVar2 + 0x448))();
      this->m_quad_tessellation_po_id = 0;
    }
    if (this->m_stencil_verification_po_id != 0) {
      (**(code **)(lVar2 + 0x448))();
      this->m_stencil_verification_po_id = 0;
    }
    if (this->m_triangles_tessellation_po_id != 0) {
      (**(code **)(lVar2 + 0x448))();
      this->m_triangles_tessellation_po_id = 0;
    }
    if (this->m_fs_id != 0) {
      (**(code **)(lVar2 + 0x470))();
      this->m_fs_id = 0;
    }
    if (this->m_quad_tessellation_tcs_id != 0) {
      (**(code **)(lVar2 + 0x470))();
      this->m_quad_tessellation_tcs_id = 0;
    }
    if (this->m_quad_tessellation_tes_id != 0) {
      (**(code **)(lVar2 + 0x470))();
      this->m_quad_tessellation_tes_id = 0;
    }
    if (this->m_triangles_tessellation_tcs_id != 0) {
      (**(code **)(lVar2 + 0x470))();
      this->m_triangles_tessellation_tcs_id = 0;
    }
    if (this->m_triangles_tessellation_tes_id != 0) {
      (**(code **)(lVar2 + 0x470))();
      this->m_triangles_tessellation_tes_id = 0;
    }
    if (this->m_vs_id != 0) {
      (**(code **)(lVar2 + 0x470))();
      this->m_vs_id = 0;
    }
    if (this->m_fbo_id != 0) {
      (**(code **)(lVar2 + 0x440))(1,&this->m_fbo_id);
      this->m_fbo_id = 0;
    }
    if (this->m_color_rbo_id != 0) {
      (**(code **)(lVar2 + 0x460))(1,&this->m_color_rbo_id);
      this->m_color_rbo_id = 0;
    }
    if (this->m_stencil_rbo_id != 0) {
      (**(code **)(lVar2 + 0x460))(1,&this->m_stencil_rbo_id);
      this->m_stencil_rbo_id = 0;
    }
    if (this->m_bo_id != 0) {
      (**(code **)(lVar2 + 0x438))(1,&this->m_bo_id);
      this->m_bo_id = 0;
    }
    if (this->m_vao_id != 0) {
      (**(code **)(lVar2 + 0x490))(1,&this->m_vao_id);
      this->m_vao_id = 0;
    }
  }
  return;
}

Assistant:

void TessellationShaderPrimitiveCoverage::deinit(void)
{
	/* Deinitialize base class */
	TestCaseBase::deinit();

	if (!m_is_tessellation_shader_supported)
	{
		return;
	}

	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset OpenGL ES state */
	gl.useProgram(0);
	gl.bindBuffer(GL_ARRAY_BUFFER, 0);
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, 0);
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, 0);
	gl.disable(GL_STENCIL_TEST);
	gl.bindVertexArray(0);

	/* Reset GL_PATCH_VERTICES_EXT to the default value. */
	gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 3);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameteriEXT() failed!");

	/* Delete buffers */
	if (m_rendered_data_buffer != DE_NULL)
	{
		free(m_rendered_data_buffer);

		m_rendered_data_buffer = DE_NULL;
	}

	/* Delete program and shader objects */
	if (m_quad_tessellation_po_id != 0)
	{
		gl.deleteProgram(m_quad_tessellation_po_id);

		m_quad_tessellation_po_id = 0;
	}

	if (m_stencil_verification_po_id != 0)
	{
		gl.deleteProgram(m_stencil_verification_po_id);

		m_stencil_verification_po_id = 0;
	}

	if (m_triangles_tessellation_po_id != 0)
	{
		gl.deleteProgram(m_triangles_tessellation_po_id);

		m_triangles_tessellation_po_id = 0;
	}

	if (m_fs_id != 0)
	{
		gl.deleteShader(m_fs_id);

		m_fs_id = 0;
	}

	if (m_quad_tessellation_tcs_id != 0)
	{
		gl.deleteShader(m_quad_tessellation_tcs_id);

		m_quad_tessellation_tcs_id = 0;
	}

	if (m_quad_tessellation_tes_id != 0)
	{
		gl.deleteShader(m_quad_tessellation_tes_id);

		m_quad_tessellation_tes_id = 0;
	}

	if (m_triangles_tessellation_tcs_id != 0)
	{
		gl.deleteShader(m_triangles_tessellation_tcs_id);

		m_triangles_tessellation_tcs_id = 0;
	}

	if (m_triangles_tessellation_tes_id != 0)
	{
		gl.deleteShader(m_triangles_tessellation_tes_id);

		m_triangles_tessellation_tes_id = 0;
	}

	if (m_vs_id != 0)
	{
		gl.deleteShader(m_vs_id);

		m_vs_id = 0;
	}

	/* Delete framebuffer and renderbuffer objects */
	if (m_fbo_id != 0)
	{
		gl.deleteFramebuffers(1, &m_fbo_id);

		m_fbo_id = 0;
	}

	if (m_color_rbo_id != 0)
	{
		gl.deleteRenderbuffers(1, &m_color_rbo_id);

		m_color_rbo_id = 0;
	}

	if (m_stencil_rbo_id != 0)
	{
		gl.deleteRenderbuffers(1, &m_stencil_rbo_id);

		m_stencil_rbo_id = 0;
	}

	/* Delete buffer objects */
	if (m_bo_id != 0)
	{
		gl.deleteBuffers(1, &m_bo_id);

		m_bo_id = 0;
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);

		m_vao_id = 0;
	}
}